

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-tval.c
# Opt level: O3

_Bool tval_can_be_artifact_k(object_kind *kind)

{
  return (_Bool)((byte)(0x7ffa0 >> ((byte)kind->tval & 0x1f)) & (uint)kind->tval < 0x13);
}

Assistant:

bool tval_can_be_artifact_k(const struct object_kind *kind)
{
	switch (kind->tval) {
		case TV_BOW:
		case TV_HAFTED:
		case TV_POLEARM:
		case TV_SWORD:
		case TV_BOOTS:
		case TV_GLOVES:
		case TV_HELM:
		case TV_CROWN:
		case TV_SHIELD:
		case TV_CLOAK:
		case TV_SOFT_ARMOR:
		case TV_HARD_ARMOR:
		case TV_DRAG_ARMOR:
			return true;
		default:
			return false;
	}
}